

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_impl.hpp
# Opt level: O2

RawType dxil_spv::raw_component_type_to_type(ComponentType type)

{
  byte bVar1;
  
  bVar1 = type + I1;
  if ((bVar1 < 0xc) && ((0xf51U >> (bVar1 & 0x1f) & 1) != 0)) {
    return *(RawType *)(&DAT_001a0558 + (ulong)bVar1 * 4);
  }
  __assert_fail("0 && \"Invalid component type.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                ,0x8d,"RawType dxil_spv::raw_component_type_to_type(DXIL::ComponentType)");
}

Assistant:

static inline RawType raw_component_type_to_type(DXIL::ComponentType type)
{
	switch (type)
	{
	case DXIL::ComponentType::InternalU8:
	case DXIL::ComponentType::U16:
	case DXIL::ComponentType::U32:
	case DXIL::ComponentType::U64:
		return RawType::Integer;
	case DXIL::ComponentType::F16:
	case DXIL::ComponentType::F32:
	case DXIL::ComponentType::F64:
		return RawType::Float;
	default:
		assert(0 && "Invalid component type.");
		return RawType::Count;
	}
}